

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O1

void __thiscall QLCDNumber::display(QLCDNumber *this,double num)

{
  QLCDNumberPrivate *this_00;
  long in_FS_OFFSET;
  bool of;
  QString local_48;
  bool local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLCDNumberPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  this_00->val = num;
  local_21 = true;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  double2string(&local_48,num,(byte)this_00->field_0x288 & 3,this_00->ndigits,&local_21);
  if (local_21 == true) {
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)0x0);
  }
  else {
    QLCDNumberPrivate::internalSetString(this_00,&local_48);
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLCDNumber::display(double num)
{
    Q_D(QLCDNumber);
    d->val = num;
    bool of;
    QString s = double2string(d->val, d->base, d->ndigits, &of);
    if (of)
        emit overflow();
    else
        d->internalSetString(s);
}